

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::HlslParseContext::convertConditionalExpression
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *condition,bool mustBeScalar)

{
  TIntermediate *this_00;
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermTyped *pTVar3;
  undefined7 in_register_00000009;
  TType local_b0;
  
  if ((int)CONCAT71(in_register_00000009,mustBeScalar) != 0) {
    iVar2 = (*(condition->super_TIntermNode)._vptr_TIntermNode[0x1e])(condition);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 200))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if (cVar1 == '\0') {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"requires a scalar","conditional expression","");
      return (TIntermTyped *)0x0;
    }
  }
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar2 = (*(condition->super_TIntermNode)._vptr_TIntermNode[0x26])(condition);
  TType::TType(&local_b0,EbtBool,EvqTemporary,iVar2,0,0,false);
  pTVar3 = TIntermediate::addConversion(this_00,EOpConstructBool,&local_b0,condition);
  return pTVar3;
}

Assistant:

TIntermTyped* HlslParseContext::convertConditionalExpression(const TSourceLoc& loc, TIntermTyped* condition,
                                                             bool mustBeScalar)
{
    if (mustBeScalar && !condition->getType().isScalarOrVec1()) {
        error(loc, "requires a scalar", "conditional expression", "");
        return nullptr;
    }

    return intermediate.addConversion(EOpConstructBool, TType(EbtBool, EvqTemporary, condition->getVectorSize()),
                                      condition);
}